

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

int diy::io::utils::mkstemp(char *__template)

{
  int iVar1;
  long lVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  unique_ptr<char[],_std::default_delete<char[]>_> *this;
  pointer pcVar3;
  int handle;
  unique_ptr<char[],_std::default_delete<char[]>_> s_template;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  
  lVar2 = std::__cxx11::string::size();
  operator_new__(lVar2 + 1);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            (in_stack_ffffffffffffffc0,
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::__cxx11::string::begin();
  __first._M_current = (char *)std::__cxx11::string::end();
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffffc0);
  std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char*>
            (__first,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::__cxx11::string::size();
  this = (unique_ptr<char[],_std::default_delete<char[]>_> *)
         std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                   (in_stack_ffffffffffffffc0,
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(undefined1 *)
   &(this->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl = 0;
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
  iVar1 = mkostemp(pcVar3,0x101001);
  if (iVar1 != -1) {
    pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
    std::__cxx11::string::operator=((string *)__template,pcVar3);
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this);
  return iVar1;
}

Assistant:

inline int mkstemp(std::string& filename)
  {
#if defined(_WIN32)

    std::string path, name;
    detail::splitpath(filename, path, name);
    char temppath[MAX_PATH];
    // note: GetTempFileName only uses the first 3 chars of the prefix (name)
    // specified.
    if (GetTempFileName(path.c_str(), name.c_str(), 0, temppath) == 0)
    {
      // failed! return invalid handle.
      return -1;
    }
    int handle = -1;
    // _sopen_s sets handle to -1 on error.
    _sopen_s(&handle, temppath, _O_WRONLY | _O_CREAT | _O_BINARY, _SH_DENYNO, _S_IWRITE);
    if (handle != -1)
      filename = temppath;
    return handle;

#else // defined(_WIN32)

    std::unique_ptr<char[]> s_template(new char[filename.size() + 1]);
    std::copy(filename.begin(), filename.end(), s_template.get());
    s_template[filename.size()] = 0;

    int handle = -1;
#if defined(__MACH__) || defined(__ANDROID_API__)
    // TODO: figure out how to open with O_SYNC
    handle = ::mkstemp(s_template.get());
#else
    handle = mkostemp(s_template.get(), O_WRONLY | O_SYNC);
#endif
    if (handle != -1)
      filename = s_template.get();
    return handle;

#endif // defined(_WIN32)
  }